

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

double pugi::impl::anon_unknown_0::convert_string_to_number(char_t *string)

{
  bool bVar1;
  char_t *in_RDI;
  undefined8 local_8;
  
  bVar1 = check_string_to_number_format(in_RDI);
  if (bVar1) {
    local_8 = strtod(in_RDI,(char **)0x0);
  }
  else {
    local_8 = gen_nan();
  }
  return local_8;
}

Assistant:

PUGI__FN double convert_string_to_number(const char_t* string)
	{
		// check string format
		if (!check_string_to_number_format(string)) return gen_nan();

		// parse string
	#ifdef PUGIXML_WCHAR_MODE
		return wcstod(string, 0);
	#else
		return strtod(string, 0);
	#endif
	}